

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReparserTester.cpp
# Opt level: O0

void __thiscall psy::C::ReparserTester::case0027(ReparserTester *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  allocator<char> local_251;
  string local_250;
  allocator<psy::C::SyntaxKind> local_229;
  SyntaxKind local_228 [20];
  iterator local_200;
  size_type local_1f8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1f0;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d8;
  Expectation local_1c0;
  Expectation local_108;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *s;
  ReparserTester *this_local;
  
  local_18 = "\nint _ ( )\n{\n    x y ;\n    x * z ;\n    x . m ;\n}\n";
  s = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"\nint _ ( )\n{\n    x y ;\n    x * z ;\n    x . m ;\n}\n",
             &local_39);
  Expectation::Expectation(&local_1c0);
  local_228[8] = PointerDeclarator;
  local_228[9] = IdentifierDeclarator;
  local_228[10] = ExpressionStatement;
  local_228[0xb] = MultiplyExpression;
  local_228[0xc] = IdentifierName;
  local_228[0xd] = IdentifierName;
  local_228[0xe] = ExpressionStatement;
  local_228[0xf] = DirectMemberAccessExpression;
  local_228[0] = DeclarationStatement;
  local_228[1] = VariableAndOrFunctionDeclaration;
  local_228[2] = TypedefName;
  local_228[3] = IdentifierDeclarator;
  local_228[4] = AmbiguousMultiplicationOrPointerDeclaration;
  local_228[5] = DeclarationStatement;
  local_228[6] = VariableAndOrFunctionDeclaration;
  local_228[7] = TypedefName;
  local_228[0x10] = IdentifierName;
  local_228[0x11] = IdentifierName;
  local_200 = local_228;
  local_1f8 = 0x12;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_229);
  __l._M_len = local_1f8;
  __l._M_array = local_200;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1f0,__l,&local_229);
  preamble_clean(&local_1d8,&local_1f0);
  pEVar1 = Expectation::AST(&local_1c0,&local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,
             "\nint _ ( )\n{\n    x y ;\n    x * z ;\n    x * z ;\n    x . m ;\n}\n",&local_251);
  pEVar1 = Expectation::ambiguity(pEVar1,&local_250);
  Expectation::Expectation(&local_108,pEVar1);
  reparse_withSyntaxCorrelation(this,&local_38,&local_108);
  Expectation::~Expectation(&local_108);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d8);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1f0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_229);
  Expectation::~Expectation(&local_1c0);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

void ReparserTester::case0027()
{
    // Source-code with error.

    auto s = R"(
int _ ( )
{
    x y ;
    x * z ;
    x . m ;
}
)";

    reparse_withSyntaxCorrelation(
                s,
                Expectation().AST(
                    preamble_clean(
                        { SyntaxKind::DeclarationStatement,
                          SyntaxKind::VariableAndOrFunctionDeclaration,
                          SyntaxKind::TypedefName,
                          SyntaxKind::IdentifierDeclarator,
                          SyntaxKind::AmbiguousMultiplicationOrPointerDeclaration,
                          SyntaxKind::DeclarationStatement,
                          SyntaxKind::VariableAndOrFunctionDeclaration,
                          SyntaxKind::TypedefName,
                          SyntaxKind::PointerDeclarator,
                          SyntaxKind::IdentifierDeclarator,
                          SyntaxKind::ExpressionStatement,
                          SyntaxKind::MultiplyExpression,
                          SyntaxKind::IdentifierName,
                          SyntaxKind::IdentifierName,
                          SyntaxKind::ExpressionStatement,
                          SyntaxKind::DirectMemberAccessExpression,
                          SyntaxKind::IdentifierName,
                          SyntaxKind::IdentifierName }))
                .ambiguity(R"(
int _ ( )
{
    x y ;
    x * z ;
    x * z ;
    x . m ;
}
)"));

}